

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O3

void __thiscall
CoreML::Specification::ItemSimilarityRecommender_ConnectedItem::CheckTypeAndMergeFrom
          (ItemSimilarityRecommender_ConnectedItem *this,MessageLite *from)

{
  double dVar1;
  ulong uVar2;
  LogMessage *other;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite !=
      (_func_int **)&PTR__ItemSimilarityRecommender_ConnectedItem_00490f08) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::ItemSimilarityRecommender_ConnectedItem *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((ItemSimilarityRecommender_ConnectedItem *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/ItemSimilarityRecommender.pb.cc"
               ,0xf7);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  if (from[1]._vptr_MessageLite != (_func_int **)0x0) {
    this->itemid_ = (uint64_t)from[1]._vptr_MessageLite;
  }
  dVar1 = (double)from[1]._internal_metadata_.ptr_;
  if (dVar1 != 0.0) {
    this->similarityscore_ = dVar1;
  }
  uVar2 = (from->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}